

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O1

void HTS_Vocoder_clear(HTS_Vocoder *v)

{
  if (v != (HTS_Vocoder *)0x0) {
    if (v->freqt_buff != (double *)0x0) {
      HTS_free(v->freqt_buff);
      v->freqt_buff = (double *)0x0;
    }
    v->freqt_size = 0;
    if (v->gc2gc_buff != (double *)0x0) {
      HTS_free(v->gc2gc_buff);
      v->gc2gc_buff = (double *)0x0;
    }
    v->gc2gc_size = 0;
    if (v->lsp2lpc_buff != (double *)0x0) {
      HTS_free(v->lsp2lpc_buff);
      v->lsp2lpc_buff = (double *)0x0;
    }
    v->lsp2lpc_size = 0;
    if (v->postfilter_buff != (double *)0x0) {
      HTS_free(v->postfilter_buff);
      v->postfilter_buff = (double *)0x0;
    }
    v->postfilter_size = 0;
    if (v->spectrum2en_buff != (double *)0x0) {
      HTS_free(v->spectrum2en_buff);
      v->spectrum2en_buff = (double *)0x0;
    }
    v->spectrum2en_size = 0;
    if (v->c != (double *)0x0) {
      HTS_free(v->c);
      v->c = (double *)0x0;
    }
    v->excite_buff_size = 0;
    v->excite_buff_index = 0;
    if (v->excite_ring_buff != (double *)0x0) {
      HTS_free(v->excite_ring_buff);
      v->excite_ring_buff = (double *)0x0;
    }
  }
  return;
}

Assistant:

void HTS_Vocoder_clear(HTS_Vocoder * v)
{
   if (v != NULL) {
      /* free buffer */
      if (v->freqt_buff != NULL) {
         HTS_free(v->freqt_buff);
         v->freqt_buff = NULL;
      }
      v->freqt_size = 0;
      if (v->gc2gc_buff != NULL) {
         HTS_free(v->gc2gc_buff);
         v->gc2gc_buff = NULL;
      }
      v->gc2gc_size = 0;
      if (v->lsp2lpc_buff != NULL) {
         HTS_free(v->lsp2lpc_buff);
         v->lsp2lpc_buff = NULL;
      }
      v->lsp2lpc_size = 0;
      if (v->postfilter_buff != NULL) {
         HTS_free(v->postfilter_buff);
         v->postfilter_buff = NULL;
      }
      v->postfilter_size = 0;
      if (v->spectrum2en_buff != NULL) {
         HTS_free(v->spectrum2en_buff);
         v->spectrum2en_buff = NULL;
      }
      v->spectrum2en_size = 0;
      if (v->c != NULL) {
         HTS_free(v->c);
         v->c = NULL;
      }
      v->excite_buff_size = 0;
      v->excite_buff_index = 0;
      if (v->excite_ring_buff != NULL) {
         HTS_free(v->excite_ring_buff);
         v->excite_ring_buff = NULL;
      }
   }
}